

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *pAVar2;
  char *pcVar3;
  uint uVar4;
  void *local_38;
  DAngle local_30;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003e8858;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e8848:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e8858:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x125e,
                  "int AF_AActor_A_SetAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar2 == (AActor *)0x0) goto LAB_003e8791;
    bVar1 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e8858;
    }
  }
  else {
    if (pAVar2 != (AActor *)0x0) goto LAB_003e8848;
LAB_003e8791:
    pAVar2 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e88a8:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x125f,
                    "int AF_AActor_A_SetAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_38 = param[1].field_0.field_1.a;
LAB_003e87dc:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e88c7:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1260,
                    "int AF_AActor_A_SetAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar4 = param[2].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e88a8;
    }
    local_38 = param[1].field_0.field_1.a;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e87dc;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e88c7;
    }
    uVar4 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e8877;
      }
      goto LAB_003e87f5;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e8877:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1261,
                  "int AF_AActor_A_SetAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003e87f5:
  pAVar2 = COPY_AAPTR(pAVar2,param[3].field_0.i);
  if (pAVar2 != (AActor *)0x0) {
    local_30.Degrees = (double)local_38;
    AActor::SetAngle(pAVar2,&local_30,SUB41((uVar4 & 2) >> 1,0));
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT_DEF(angle);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);
	if (ref != NULL)
	{
		ref->SetAngle(angle, !!(flags & SPF_INTERPOLATE));
	}
	return 0;
}